

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O3

unique_ptr<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>
s2textformat::MakeLaxPolygonOrDie(string_view str)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  char *in_RDX;
  __uniq_ptr_data<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>,_true,_true> lax_polygon
  ;
  pointer *__ptr;
  string_view str_00;
  string_view piece;
  S2LogMessage SStack_28;
  
  lax_polygon.super___uniq_ptr_impl<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>._M_t
  .super__Tuple_impl<0UL,_S2LaxPolygonShape_*,_std::default_delete<S2LaxPolygonShape>_>.
  super__Head_base<0UL,_S2LaxPolygonShape_*,_false>._M_head_impl =
       (__uniq_ptr_impl<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>)str.ptr_;
  *(undefined8 *)
   lax_polygon.super___uniq_ptr_impl<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>.
   _M_t.super__Tuple_impl<0UL,_S2LaxPolygonShape_*,_std::default_delete<S2LaxPolygonShape>_>.
   super__Head_base<0UL,_S2LaxPolygonShape_*,_false>._M_head_impl = 0;
  str_00.length_ = (size_type)in_RDX;
  str_00.ptr_ = (char *)str.length_;
  bVar1 = MakeLaxPolygon(str_00,(unique_ptr<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>
                                 *)lax_polygon.
                                   super___uniq_ptr_impl<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_S2LaxPolygonShape_*,_std::default_delete<S2LaxPolygonShape>_>
                                   .super__Head_base<0UL,_S2LaxPolygonShape_*,_false>._M_head_impl);
  if (bVar1) {
    return (__uniq_ptr_data<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>,_true,_true>)
           (tuple<S2LaxPolygonShape_*,_std::default_delete<S2LaxPolygonShape>_>)
           lax_polygon.
           super___uniq_ptr_impl<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>._M_t.
           super__Tuple_impl<0UL,_S2LaxPolygonShape_*,_std::default_delete<S2LaxPolygonShape>_>.
           super__Head_base<0UL,_S2LaxPolygonShape_*,_false>._M_head_impl;
  }
  sVar3 = 3;
  S2LogMessage::S2LogMessage
            (&SStack_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
             ,0x119,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_28.stream_,"Check failed: MakeLaxPolygon(str, &lax_polygon) ",0x30);
  std::__ostream_insert<char,std::char_traits<char>>(SStack_28.stream_,": str == \"",10);
  piece.length_ = sVar3;
  piece.ptr_ = in_RDX;
  poVar2 = absl::operator<<((absl *)SStack_28.stream_,(ostream *)str.length_,piece);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
  abort();
}

Assistant:

unique_ptr<S2LaxPolygonShape> MakeLaxPolygonOrDie(string_view str) {
  unique_ptr<S2LaxPolygonShape> lax_polygon;
  S2_CHECK(MakeLaxPolygon(str, &lax_polygon)) << ": str == \"" << str << "\"";
  return lax_polygon;
}